

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

PtexCachedReader * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::get
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,StringKey *key)

{
  uint32_t uVar1;
  Entry *pEVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar1 = this->_numEntries;
  do {
    pEVar2 = this->_entries;
  } while (pEVar2 == (Entry *)0x0);
  uVar4 = key->_hash;
  do {
    uVar5 = uVar4 & uVar1 - 1;
    bVar3 = StringKey::matches(&pEVar2[uVar5].key,key);
    if (bVar3) {
      return pEVar2[uVar5].value;
    }
    uVar4 = uVar4 + 1;
  } while (pEVar2[uVar5].value != (PtexCachedReader *)0x0);
  return (PtexCachedReader *)0x0;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }